

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_goaway_init
               (nghttp2_goaway *frame,int32_t last_stream_id,uint32_t error_code,
               uint8_t *opaque_data,size_t opaque_data_len)

{
  size_t opaque_data_len_local;
  uint8_t *opaque_data_local;
  uint32_t error_code_local;
  int32_t last_stream_id_local;
  nghttp2_goaway *frame_local;
  
  nghttp2_frame_hd_init(&frame->hd,opaque_data_len + 8,'\a','\0',0);
  frame->last_stream_id = last_stream_id;
  frame->error_code = error_code;
  frame->opaque_data = opaque_data;
  frame->opaque_data_len = opaque_data_len;
  frame->reserved = '\0';
  return;
}

Assistant:

void nghttp2_frame_goaway_init(nghttp2_goaway *frame, int32_t last_stream_id,
                               uint32_t error_code, uint8_t *opaque_data,
                               size_t opaque_data_len) {
  nghttp2_frame_hd_init(&frame->hd, 8 + opaque_data_len, NGHTTP2_GOAWAY,
                        NGHTTP2_FLAG_NONE, 0);
  frame->last_stream_id = last_stream_id;
  frame->error_code = error_code;
  frame->opaque_data = opaque_data;
  frame->opaque_data_len = opaque_data_len;
  frame->reserved = 0;
}